

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::Postprocess_BuildNode
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  int iVar1;
  EType EVar2;
  CX3DImporter_NodeElement *pNodeElement_00;
  long lVar3;
  undefined8 *******pppppppuVar4;
  _func_int **pp_Var5;
  pointer pcVar6;
  size_type sVar7;
  undefined8 uVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar14;
  aiNode *this_00;
  _List_node_base *p_Var15;
  aiNode **ppaVar16;
  uint *puVar17;
  runtime_error *this_01;
  long *plVar18;
  long *plVar19;
  CX3DImporter_NodeElement_Group *tne_group;
  const_iterator it;
  undefined8 *******pppppppuVar20;
  _List_node_base *p_Var21;
  list<aiNode_*,_std::allocator<aiNode_*>_> SceneNode_Child;
  list<unsigned_int,_std::allocator<unsigned_int>_> SceneNode_Mesh;
  undefined8 *******local_c0;
  undefined8 *******local_b8;
  ulong local_b0;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var15 = (pNodeElement->Child).
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_c0 = &local_c0;
  local_b0 = 0;
  local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size = 0
  ;
  local_b8 = local_c0;
  local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  Postprocess_CollectMetadata(this,pNodeElement,pSceneNode);
  p_Var21 = (_List_node_base *)&pNodeElement->Child;
  p_Var10 = p_Var15;
  pppppppuVar20 = local_c0;
  if (pNodeElement->Type == ENET_Group) {
    pp_Var5 = pNodeElement[1]._vptr_CX3DImporter_NodeElement;
    EVar2 = pNodeElement[1].Type;
    uVar13 = *(undefined4 *)&pNodeElement[1].field_0xc;
    pcVar6 = pNodeElement[1].ID._M_dataplus._M_p;
    uVar11 = *(undefined4 *)&pNodeElement[1].ID._M_string_length;
    uVar12 = *(undefined4 *)((long)&pNodeElement[1].ID._M_string_length + 4);
    sVar7 = pNodeElement[1].ID.field_2._M_allocated_capacity;
    uVar8 = *(undefined8 *)((long)&pNodeElement[1].ID.field_2 + 8);
    p_Var9 = pNodeElement[1].Child.
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    *(CX3DImporter_NodeElement **)&(pSceneNode->mTransformation).d1 = pNodeElement[1].Parent;
    *(_List_node_base **)&(pSceneNode->mTransformation).d3 = p_Var9;
    (pSceneNode->mTransformation).c1 = (float)(int)sVar7;
    (pSceneNode->mTransformation).c2 = (float)(int)(sVar7 >> 0x20);
    (pSceneNode->mTransformation).c3 = (float)(int)uVar8;
    (pSceneNode->mTransformation).c4 = (float)(int)((ulong)uVar8 >> 0x20);
    *(pointer *)&(pSceneNode->mTransformation).b1 = pcVar6;
    (pSceneNode->mTransformation).b3 = (float)uVar11;
    (pSceneNode->mTransformation).b4 = (float)uVar12;
    *(_func_int ***)&pSceneNode->mTransformation = pp_Var5;
    (pSceneNode->mTransformation).a3 = (float)EVar2;
    (pSceneNode->mTransformation).a4 = (float)uVar13;
    if (*(char *)((long)&pNodeElement[1].Child.
                         super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1) == '\x01') {
      iVar1 = *(int *)((long)&pNodeElement[1].Child.
                              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 4);
      uVar14 = (ulong)iVar1;
      p_Var10 = p_Var21;
      if ((-1 < (long)uVar14) &&
         (uVar14 < (pNodeElement->Child).
                   super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                   ._M_impl._M_node._M_size)) {
        if (iVar1 != 0) {
          do {
            p_Var15 = p_Var15->_M_next;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        p_Var21 = p_Var15->_M_next;
        p_Var10 = p_Var15;
      }
    }
  }
  do {
    local_c0 = pppppppuVar20;
    if (p_Var10 == p_Var21) {
      if ((undefined8 ********)pppppppuVar20 != &local_c0) {
        pSceneNode->mNumChildren = (uint)local_b0;
        ppaVar16 = (aiNode **)operator_new__((local_b0 & 0xffffffff) << 3);
        pSceneNode->mChildren = ppaVar16;
        if (pSceneNode->mNumChildren != 0) {
          uVar14 = 0;
          do {
            pppppppuVar4 = pppppppuVar20 + 2;
            pppppppuVar20 = (undefined8 *******)*pppppppuVar20;
            pSceneNode->mChildren[uVar14] = (aiNode *)*pppppppuVar4;
            uVar14 = uVar14 + 1;
          } while (uVar14 < pSceneNode->mNumChildren);
        }
      }
      p_Var21 = local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      p_Var15 = local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      if (local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)&local_a8) {
        pSceneNode->mNumMeshes =
             (uint)local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   _M_node._M_size;
        puVar17 = (uint *)operator_new__((local_a8.
                                          super__List_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl._M_node._M_size & 0xffffffff) << 2);
        pSceneNode->mMeshes = puVar17;
        p_Var15 = local_a8.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next;
        if (pSceneNode->mNumMeshes != 0) {
          uVar14 = 0;
          do {
            p_Var10 = p_Var21 + 1;
            p_Var21 = p_Var21->_M_next;
            pSceneNode->mMeshes[uVar14] = *(uint *)&p_Var10->_M_next;
            uVar14 = uVar14 + 1;
          } while (uVar14 < pSceneNode->mNumMeshes);
        }
      }
      while (pppppppuVar20 = local_c0, p_Var15 != (_List_node_base *)&local_a8) {
        p_Var21 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var15->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var15);
        p_Var15 = p_Var21;
      }
      while ((undefined8 ********)pppppppuVar20 != &local_c0) {
        pppppppuVar4 = (undefined8 *******)*pppppppuVar20;
        operator_delete(pppppppuVar20);
        pppppppuVar20 = pppppppuVar4;
      }
      return;
    }
    pNodeElement_00 = (CX3DImporter_NodeElement *)p_Var10[1]._M_next;
    EVar2 = pNodeElement_00->Type;
    if (EVar2 - ENET_DirectionalLight < 3) {
      Postprocess_BuildLight(this,pNodeElement_00,pSceneLightList);
    }
    else if (EVar2 == ENET_Shape) {
      Postprocess_BuildShape
                (this,(CX3DImporter_NodeElement_Shape *)pNodeElement_00,&local_a8,pSceneMeshList,
                 pSceneMaterialList);
    }
    else if (EVar2 == ENET_Group) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      lVar3 = (long)p_Var10[1]._M_next;
      uVar14 = *(ulong *)(lVar3 + 0x18);
      if (uVar14 < 0x400) {
        (this_00->mName).length = (ai_uint32)uVar14;
        memcpy((this_00->mName).data,*(void **)(lVar3 + 0x10),uVar14);
        (this_00->mName).data[uVar14] = '\0';
      }
      this_00->mParent = pSceneNode;
      p_Var15 = (_List_node_base *)operator_new(0x18);
      p_Var15[1]._M_next = (_List_node_base *)this_00;
      std::__detail::_List_node_base::_M_hook(p_Var15);
      local_b0 = local_b0 + 1;
      Postprocess_BuildNode
                (this,(CX3DImporter_NodeElement *)p_Var10[1]._M_next,this_00,pSceneMeshList,
                 pSceneMaterialList,pSceneLightList);
    }
    else if (5 < EVar2 - ENET_MetaBoolean) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<CX3DImporter_NodeElement::EType>(&local_70,*(EType *)((long)p_Var10[1]._M_next + 8))
      ;
      std::operator+(&local_50,"Postprocess_BuildNode. Unknown type: ",&local_70);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar18;
      plVar19 = plVar18 + 2;
      if (local_90 == plVar19) {
        local_80 = *plVar19;
        lStack_78 = plVar18[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar19;
      }
      local_88 = plVar18[1];
      *plVar18 = (long)plVar19;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      std::runtime_error::runtime_error(this_01,(string *)&local_90);
      *(undefined ***)this_01 = &PTR__runtime_error_00896c98;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var10 = p_Var10->_M_next;
    pppppppuVar20 = local_c0;
  } while( true );
}

Assistant:

void X3DImporter::Postprocess_BuildNode(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode, std::list<aiMesh*>& pSceneMeshList,
										std::list<aiMaterial*>& pSceneMaterialList, std::list<aiLight*>& pSceneLightList) const
{
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_begin = pNodeElement.Child.begin();
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_end = pNodeElement.Child.end();
    std::list<aiNode*> SceneNode_Child;
    std::list<unsigned int> SceneNode_Mesh;

	// At first read all metadata
	Postprocess_CollectMetadata(pNodeElement, pSceneNode);
	// check if we have deal with grouping node. Which can contain transformation or switch
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)
	{
		const CX3DImporter_NodeElement_Group& tne_group = *((CX3DImporter_NodeElement_Group*)&pNodeElement);// create alias for convenience

		pSceneNode.mTransformation = tne_group.Transformation;
		if(tne_group.UseChoice)
		{
			// If Choice is less than zero or greater than the number of nodes in the children field, nothing is chosen.
			if((tne_group.Choice < 0) || ((size_t)tne_group.Choice >= pNodeElement.Child.size()))
			{
				chit_begin = pNodeElement.Child.end();
				chit_end = pNodeElement.Child.end();
			}
			else
			{
				for(size_t i = 0; i < (size_t)tne_group.Choice; i++) ++chit_begin;// forward iterator to chosen node.

				chit_end = chit_begin;
				++chit_end;// point end iterator to next element after chosen node.
			}
		}// if(tne_group.UseChoice)
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)

	// Reserve memory for fast access and check children.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; ++it)
	{// in this loop we do not read metadata because it's already read at begin.
		if((*it)->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			// if child is group then create new node and do recursive call.
			aiNode* new_node = new aiNode;

			new_node->mName = (*it)->ID;
			new_node->mParent = &pSceneNode;
			SceneNode_Child.push_back(new_node);
			Postprocess_BuildNode(**it, *new_node, pSceneMeshList, pSceneMaterialList, pSceneLightList);
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Shape)
		{
			// shape can contain only one geometry and one appearance nodes.
			Postprocess_BuildShape(*((CX3DImporter_NodeElement_Shape*)*it), SceneNode_Mesh, pSceneMeshList, pSceneMaterialList);
		}
		else if(((*it)->Type == CX3DImporter_NodeElement::ENET_DirectionalLight) || ((*it)->Type == CX3DImporter_NodeElement::ENET_PointLight) ||
				((*it)->Type == CX3DImporter_NodeElement::ENET_SpotLight))
		{
			Postprocess_BuildLight(*((CX3DImporter_NodeElement_Light*)*it), pSceneLightList);
		}
		else if(!PostprocessHelper_ElementIsMetadata((*it)->Type))// skip metadata
		{
			throw DeadlyImportError("Postprocess_BuildNode. Unknown type: " + to_string((*it)->Type) + ".");
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; it++)

	// copy data about children and meshes to aiNode.
	if(!SceneNode_Child.empty())
	{
		std::list<aiNode*>::const_iterator it = SceneNode_Child.begin();

		pSceneNode.mNumChildren = static_cast<unsigned int>(SceneNode_Child.size());
		pSceneNode.mChildren = new aiNode*[pSceneNode.mNumChildren];
		for(size_t i = 0; i < pSceneNode.mNumChildren; i++) pSceneNode.mChildren[i] = *it++;
	}

	if(!SceneNode_Mesh.empty())
	{
		std::list<unsigned int>::const_iterator it = SceneNode_Mesh.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(SceneNode_Mesh.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *it++;
	}

	// that's all. return to previous deals
}